

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O1

void __thiscall
duckdb::UndoBuffer::RevertCommit
          (UndoBuffer *this,IteratorState *end_state,transaction_t transaction_id)

{
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoFlags *pUVar3;
  IteratorState start_state;
  CommitState state;
  BufferHandle BStack_88;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_70;
  UndoFlags *local_68;
  UndoFlags *local_60;
  CommitState local_58;
  BufferHandle local_48;
  
  CommitState::CommitState(&local_58,this->transaction,transaction_id);
  BufferHandle::BufferHandle(&BStack_88);
  local_70.ptr = (this->allocator).tail.ptr;
  if (local_70.ptr != (UndoBufferEntry *)0x0) {
    do {
      pBVar2 = (this->allocator).buffer_manager;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_70);
      (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&(local_70.ptr)->block);
      BufferHandle::operator=(&BStack_88,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&BStack_88.node);
      pUVar3 = (UndoFlags *)(BStack_88.node.ptr)->buffer;
      local_68 = pUVar3;
      if (local_70.ptr == (end_state->current).ptr) {
        local_60 = (UndoFlags *)end_state->start;
      }
      else {
        optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_70);
        local_60 = (UndoFlags *)((long)pUVar3 + (local_70.ptr)->position);
      }
      if (local_68 < local_60) {
        do {
          type = *local_68;
          UVar1 = local_68[1];
          local_68 = local_68 + 2;
          CommitState::RevertCommit(&local_58,type,(data_ptr_t)local_68);
          local_68 = (UndoFlags *)((ulong)UVar1 + (long)local_68);
        } while (local_68 < local_60);
      }
      if (local_70.ptr == (end_state->current).ptr) break;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_70);
      local_70.ptr = ((local_70.ptr)->prev).ptr;
    } while (local_70.ptr != (UndoBufferEntry *)0x0);
  }
  BufferHandle::~BufferHandle(&BStack_88);
  return;
}

Assistant:

void UndoBuffer::RevertCommit(UndoBuffer::IteratorState &end_state, transaction_t transaction_id) {
	CommitState state(transaction, transaction_id);
	UndoBuffer::IteratorState start_state;
	IterateEntries(start_state, end_state, [&](UndoFlags type, data_ptr_t data) { state.RevertCommit(type, data); });
}